

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr GetFunctionVariableUpvalueName(ExpressionContext *ctx,VariableData *variable)

{
  byte *pbVar1;
  byte bVar2;
  InplaceStr name;
  InplaceStr IVar3;
  InplaceStr IVar4;
  int iVar5;
  FunctionData *pFVar6;
  undefined4 extraout_var;
  ulong uVar7;
  byte *pbVar8;
  size_t sVar9;
  byte *pbVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  char *unaff_RBX;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  InplaceStr IVar18;
  InplaceStr IVar19;
  byte local_48;
  byte local_47 [15];
  char *in_stack_ffffffffffffffc8;
  
  pFVar6 = ExpressionContext::GetFunctionOwner(ctx,variable->scope);
  if (pFVar6 == (FunctionData *)0x0) {
    pcVar16 = "";
    pcVar15 = "global";
  }
  else {
    pcVar15 = (pFVar6->name->name).begin;
    pcVar16 = (pFVar6->name->name).end;
  }
  IVar4.end = pcVar16;
  IVar4.begin = pcVar15;
  IVar18.end = pcVar16;
  IVar18.begin = pcVar15;
  IVar3.end = pcVar16;
  IVar3.begin = pcVar15;
  bVar2 = *pcVar15;
  if ((((char)bVar2 < 'A' && bVar2 != 0x24) ||
      ((bVar2 - 0x5e < 0x21 &&
       (IVar3 = IVar18, (0x140000001U >> ((ulong)(bVar2 - 0x5e) & 0x3f) & 1) != 0)))) &&
     (name.end = unaff_RBX, name.begin = in_stack_ffffffffffffffc8, IVar18 = GetOperatorName(name),
     IVar3 = IVar4, IVar18.begin != IVar18.end)) {
    IVar3 = IVar18;
  }
  uVar17 = (long)IVar3.end - (long)IVar3.begin;
  uVar13 = (*(int *)&(variable->name->name).end - *(int *)&(variable->name->name).begin) +
           (int)uVar17 + 0x19;
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar13);
  IVar19.begin = (char *)CONCAT44(extraout_var,iVar5);
  builtin_strncpy(IVar19.begin,"$upvalue_",10);
  uVar17 = uVar17 & 0xffffffff;
  memcpy(IVar19.begin + 9,IVar3.begin,uVar17);
  (IVar19.begin + uVar17 + 10)[-1] = '_';
  pcVar15 = (variable->name->name).begin;
  memcpy(IVar19.begin + uVar17 + 10,pcVar15,
         (ulong)(uint)(*(int *)&(variable->name->name).end - (int)pcVar15));
  uVar7 = (ulong)(uint)(*(int *)&(variable->name->name).end - *(int *)&(variable->name->name).begin)
  ;
  IVar19.begin[uVar7 + 1 + uVar17 + 9] = '_';
  uVar11 = variable->uniqueId;
  uVar12 = (ulong)uVar11;
  pbVar10 = local_47;
  local_48 = (char)uVar11 + (char)(uVar11 / 10) * -10 | 0x30;
  if (9 < uVar12) {
    do {
      uVar11 = (uint)uVar12;
      uVar14 = uVar12 / 10;
      uVar12 = uVar12 / 10;
      *pbVar10 = (char)uVar12 + (char)(uVar14 * 0x1999999a >> 0x20) * -10 | 0x30;
      pbVar10 = pbVar10 + 1;
    } while (99 < uVar11);
  }
  pbVar8 = (byte *)(IVar19.begin + uVar7 + uVar17 + 9 + 2);
  do {
    pbVar1 = pbVar10 + -1;
    pbVar10 = pbVar10 + -1;
    *pbVar8 = *pbVar1;
    pbVar8 = pbVar8 + 1;
  } while (pbVar10 != &local_48);
  *pbVar8 = 0;
  sVar9 = strlen(IVar19.begin);
  if (uVar13 <= sVar9) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x204,
                  "InplaceStr GetFunctionVariableUpvalueName(ExpressionContext &, VariableData *)");
  }
  IVar19.end = IVar19.begin + sVar9;
  return IVar19;
}

Assistant:

InplaceStr GetFunctionVariableUpvalueName(ExpressionContext &ctx, VariableData *variable)
{
	FunctionData *function = ctx.GetFunctionOwner(variable->scope);

	InplaceStr functionName = function ? function->name->name : InplaceStr("global");

	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + variable->name->name.length() + 24 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	strcpy(pos, "$upvalue_");
	pos += strlen("$upvalue_");

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';

	memcpy(pos, variable->name->name.begin, variable->name->name.length());
	pos += variable->name->name.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, variable->uniqueId);

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}